

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_2c92::ndiGXHelper(ndicapi *pol,char *command,char *commandReply)

{
  char cVar1;
  ulong uVar2;
  char (*pacVar3) [12];
  char (*pacVar4) [24];
  char (*pacVar5) [8];
  ulong uVar6;
  char (*pacVar7) [52];
  long lVar8;
  long lVar9;
  ulong uVar10;
  char (*pacVar11) [52];
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  
  uVar2 = 1;
  if (command[2] == ' ') {
    cVar1 = command[3];
  }
  else {
    if (command[2] != ':') goto LAB_00108456;
    cVar1 = command[7];
  }
  if (cVar1 != '\r') {
    uVar2 = ndiHexToUnsignedLong(command + 3,4);
  }
LAB_00108456:
  if ((uVar2 & 1) != 0) {
    pacVar7 = pol->GxTransforms;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        if (commandReply[lVar9] < ' ') break;
        (*pacVar7)[lVar9] = commandReply[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x33);
      pcVar12 = commandReply + lVar9;
      (*pacVar7)[lVar9] = '\0';
      cVar1 = *pcVar12;
      commandReply = pcVar12 + (cVar1 == '\n');
      lVar8 = lVar8 + 1;
      pacVar7 = pacVar7 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      if (pcVar12[lVar8 + (ulong)(cVar1 == '\n')] < ' ') break;
      pol->GxStatus[lVar8] = pcVar12[lVar8 + (ulong)(cVar1 == '\n')];
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != 8);
    commandReply = pcVar12 + (ulong)(cVar1 == '\n') + lVar8 +
                   (pcVar12[(ulong)(cVar1 == '\n') + lVar8] == '\n');
  }
  if ((uVar2 & 2) != 0) {
    pacVar3 = pol->GxInformation;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        if (commandReply[lVar9] < ' ') break;
        (*pacVar3)[lVar9] = commandReply[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0xc);
      commandReply = commandReply + lVar9;
      lVar8 = lVar8 + 1;
      pacVar3 = pacVar3 + 1;
    } while (lVar8 != 3);
    commandReply = commandReply + (*commandReply == '\n');
  }
  if ((uVar2 & 4) != 0) {
    pacVar4 = pol->GxSingleStray;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        if (commandReply[lVar9] < ' ') break;
        (*pacVar4)[lVar9] = commandReply[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x15);
      (*pacVar4)[lVar9] = '\0';
      commandReply = commandReply + lVar9 + (commandReply[lVar9] == '\n');
      lVar8 = lVar8 + 1;
      pacVar4 = pacVar4 + 1;
    } while (lVar8 != 3);
  }
  if ((uVar2 & 8) != 0) {
    pacVar5 = pol->GxFrame;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        if (commandReply[lVar9] < ' ') break;
        (*pacVar5)[lVar9] = commandReply[lVar9];
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 8);
      commandReply = commandReply + lVar9;
      lVar8 = lVar8 + 1;
      pacVar5 = pacVar5 + 1;
    } while (lVar8 != 3);
    commandReply = commandReply + (*commandReply == '\n');
  }
  if ((short)uVar2 < 0) {
    uVar6 = 9;
    if (((uint)uVar2 >> 0xd & 1) == 0) {
      uVar6 = 3;
    }
    if (uVar2 == 0x8000 || (uVar2 & 1) != 0) {
      pacVar7 = pol->GxPassiveTransforms;
      pcVar12 = pol->GxPassiveStatus;
      uVar10 = 0;
      do {
        lVar8 = 0;
        pacVar11 = pacVar7;
        do {
          lVar9 = 0;
          do {
            if (commandReply[lVar9] < ' ') break;
            (*pacVar11)[lVar9] = commandReply[lVar9];
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 != 0x33);
          pcVar13 = commandReply + lVar9;
          (*pacVar11)[lVar9] = '\0';
          cVar1 = *pcVar13;
          commandReply = pcVar13 + (cVar1 == '\n');
          lVar8 = lVar8 + 1;
          pacVar11 = pacVar11 + 1;
        } while (lVar8 != 3);
        lVar8 = 0;
        do {
          if (pcVar13[lVar8 + (ulong)(cVar1 == '\n')] < ' ') break;
          pcVar12[lVar8] = pcVar13[lVar8 + (ulong)(cVar1 == '\n')];
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 8);
        uVar10 = uVar10 + 3;
        bVar14 = pcVar13[(ulong)(cVar1 == '\n') + lVar8] == '\n';
        if (!bVar14) {
          uVar6 = uVar10 & 0xffffffff;
        }
        commandReply = pcVar13 + (ulong)(cVar1 == '\n') + lVar8 + bVar14;
        pacVar7 = pacVar7 + 3;
        pcVar12 = pcVar12 + 8;
      } while ((long)uVar10 < (long)(int)uVar6);
      commandReply = commandReply + (*commandReply == '\n');
    }
    if ((uVar2 & 2) != 0) {
      if (0 < (int)uVar6) {
        pacVar3 = pol->GxPassiveInformation;
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            if (commandReply[lVar8] < ' ') break;
            (*pacVar3)[lVar8] = commandReply[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0xc);
          commandReply = commandReply + lVar8;
          uVar10 = uVar10 + 1;
          pacVar3 = pacVar3 + 1;
        } while (uVar10 != uVar6);
      }
      commandReply = commandReply + (*commandReply == '\n');
    }
    if ((uVar2 & 8) != 0) {
      if (0 < (int)uVar6) {
        pacVar5 = pol->GxPassiveFrame;
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            if (commandReply[lVar8] < ' ') break;
            (*pacVar5)[lVar8] = commandReply[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 8);
          commandReply = commandReply + lVar8;
          uVar10 = uVar10 + 1;
          pacVar5 = pacVar5 + 1;
        } while (uVar10 != uVar6);
      }
      commandReply = commandReply + (*commandReply == '\n');
    }
    if (((uint)uVar2 >> 0xc & 1) != 0) {
      lVar8 = 0;
      do {
        if (commandReply[lVar8] < ' ') {
          return;
        }
        pol->GxPassiveStray[lVar8] = commandReply[lVar8];
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 != 0x1a7);
    }
  }
  return;
}

Assistant:

void ndiGXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, k;
    int passiveCount, activeCount;

    // if the GX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // always three active ports
    activeCount = 3;

    if (mode & NDI_XFORMS_AND_STATUS)
    {
      for (k = 0; k < activeCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxTransforms[i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_SINGLE_STRAY)
    {
      // grab stray marker for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxSingleStray[i];
        for (j = 0; j < 21 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        *writePointer = '\0';
        // eat the trailing newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    if ((mode & NDI_XFORMS_AND_STATUS) || (mode == NDI_PASSIVE))
    {
      // the information is grouped in threes
      for (k = 0; k < passiveCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxPassiveTransforms[k + i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxPassiveStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // skip the newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
        else   // no newline: no more passive transforms
        {
          passiveCount = k + 3;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // get all the passive stray information
      // this will be a maximum of 3 + 20*3*7 = 423 bytes
      writePointer = pol->GxPassiveStray;
      for (j = 0; j < 423 && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
    }
  }